

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UConverter * ucnv_createConverter_63(UConverter *myUConverter,char *converterName,UErrorCode *err)

{
  UBool UVar1;
  UConverterSharedData *mySharedConverterData_00;
  UConverter *pUVar2;
  UConverterSharedData *mySharedConverterData;
  UConverterLoadArgs stackArgs;
  UConverterNamePieces stackPieces;
  UErrorCode *err_local;
  char *converterName_local;
  UConverter *myUConverter_local;
  
  memset(&mySharedConverterData,0,0x28);
  mySharedConverterData._0_4_ = 0x28;
  UVar1 = U_SUCCESS(*err);
  if (UVar1 != '\0') {
    mySharedConverterData_00 =
         ucnv_loadSharedData_63
                   (converterName,(UConverterNamePieces *)&stackArgs.locale,
                    (UConverterLoadArgs *)&mySharedConverterData,err);
    pUVar2 = ucnv_createConverterFromSharedData_63
                       (myUConverter,mySharedConverterData_00,
                        (UConverterLoadArgs *)&mySharedConverterData,err);
    UVar1 = U_SUCCESS(*err);
    if (UVar1 != '\0') {
      return pUVar2;
    }
  }
  return (UConverter *)0x0;
}

Assistant:

U_CAPI UConverter *
ucnv_createConverter(UConverter *myUConverter, const char *converterName, UErrorCode * err)
{
    UConverterNamePieces stackPieces;
    UConverterLoadArgs stackArgs=UCNV_LOAD_ARGS_INITIALIZER;
    UConverterSharedData *mySharedConverterData;

    UTRACE_ENTRY_OC(UTRACE_UCNV_OPEN);

    if(U_SUCCESS(*err)) {
        UTRACE_DATA1(UTRACE_OPEN_CLOSE, "open converter %s", converterName);

        mySharedConverterData = ucnv_loadSharedData(converterName, &stackPieces, &stackArgs, err);

        myUConverter = ucnv_createConverterFromSharedData(
            myUConverter, mySharedConverterData,
            &stackArgs,
            err);

        if(U_SUCCESS(*err)) {
            UTRACE_EXIT_PTR_STATUS(myUConverter, *err);
            return myUConverter;
        }
    }

    /* exit with error */
    UTRACE_EXIT_STATUS(*err);
    return NULL;
}